

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regtrav.c
# Opt level: O0

int onig_capture_tree_traverse
              (OnigRegion *region,int at,_func_int_int_int_int_int_int_void_ptr *callback_func,
              void *arg)

{
  int iVar1;
  void *arg_local;
  _func_int_int_int_int_int_int_void_ptr *callback_func_local;
  int at_local;
  OnigRegion *region_local;
  
  iVar1 = capture_tree_traverse(region->history_root,at,callback_func,0,arg);
  return iVar1;
}

Assistant:

extern int
onig_capture_tree_traverse(OnigRegion* region, int at,
                  int(*callback_func)(int,int,int,int,int,void*), void* arg)
{
#ifdef USE_CAPTURE_HISTORY
  return capture_tree_traverse(region->history_root, at,
                               callback_func, 0, arg);
#else
  return ONIG_NO_SUPPORT_CONFIG;
#endif
}